

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,int _d,int _c,
                  Allocator *_allocator)

{
  size_t _elemsize;
  int _w_00;
  ulong uVar1;
  long lVar2;
  long lVar3;
  Mat tmp;
  
  _w_00 = this->h * this->w * this->d * this->c;
  if (_w_00 == _d * _c * _h * _w) {
    if (this->dims < 3) {
      lVar2 = (long)_d * (long)_h * (long)_w;
      _elemsize = this->elemsize;
      if (lVar2 - (_elemsize * lVar2 + 0xf & 0xfffffffffffffff0) / _elemsize != 0) {
        __return_storage_ptr__->cstep = 0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->d = 0;
        __return_storage_ptr__->c = 0;
        create(__return_storage_ptr__,_w,_h,_d,_c,_elemsize,this->elempack,_allocator);
        lVar3 = 0;
        if (_c < 1) {
          _c = 0;
        }
        for (uVar1 = 0; (uint)_c != uVar1; uVar1 = uVar1 + 1) {
          memcpy((void *)(__return_storage_ptr__->cstep * uVar1 * __return_storage_ptr__->elemsize +
                         (long)__return_storage_ptr__->data),
                 (void *)(lVar3 * this->elemsize + (long)this->data),this->elemsize * lVar2);
          lVar3 = lVar3 + lVar2;
        }
        return __return_storage_ptr__;
      }
    }
    else {
      if (this->c != _c) {
        reshape(&tmp,this,_w_00,_allocator);
        reshape(__return_storage_ptr__,&tmp,_w,_h,_d,_c,_allocator);
        ~Mat(&tmp);
        return __return_storage_ptr__;
      }
      lVar2 = (long)_d * (long)_h * (long)_w;
    }
    Mat(__return_storage_ptr__,this);
    __return_storage_ptr__->dims = 4;
    __return_storage_ptr__->w = _w;
    __return_storage_ptr__->h = _h;
    __return_storage_ptr__->d = _d;
    __return_storage_ptr__->c = _c;
    __return_storage_ptr__->cstep =
         (lVar2 * this->elemsize + 0xf & 0xfffffffffffffff0) / this->elemsize;
  }
  else {
    __return_storage_ptr__->cstep = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->d = 0;
    __return_storage_ptr__->c = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::reshape(int _w, int _h, int _d, int _c, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h * _d * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h * _d != alignSize((size_t)_w * _h * _d * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _d, _c, elemsize, elempack, _allocator);

            // align channel
            for (int i = 0; i < _c; i++)
            {
                const void* ptr = (unsigned char*)data + (size_t)i * _w * _h * _d * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, (size_t)_w * _h * _d * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _d * _c, _allocator);
        return tmp.reshape(_w, _h, _d, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 4;
    m.w = _w;
    m.h = _h;
    m.d = _d;
    m.c = _c;

    m.cstep = alignSize((size_t)_w * _h * _d * elemsize, 16) / elemsize;

    return m;
}